

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::setIconSize(QAbstractItemView *this,QSize *size)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  void *local_28;
  QSize *pQStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  iVar3 = -(uint)((int)*(undefined8 *)(lVar1 + 0x42c) == (*size).wd.m_i);
  iVar4 = -(uint)((int)((ulong)*(undefined8 *)(lVar1 + 0x42c) >> 0x20) == (*size).ht.m_i);
  auVar2._4_4_ = iVar3;
  auVar2._0_4_ = iVar3;
  auVar2._8_4_ = iVar4;
  auVar2._12_4_ = iVar4;
  iVar3 = movmskpd((int)local_18,auVar2);
  if (iVar3 != 3) {
    *(QSize *)(lVar1 + 0x42c) = *size;
    if (*(char *)(lVar1 + 0x492) == '\0') {
      *(undefined1 *)(lVar1 + 0x492) = 1;
      QBasicTimer::start(lVar1 + 0x538,0,1,*(undefined8 *)(lVar1 + 8));
    }
    local_28 = (void *)0x0;
    pQStack_20 = size;
    QMetaObject::activate((QObject *)this,&staticMetaObject,6,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::setIconSize(const QSize &size)
{
    Q_D(QAbstractItemView);
    if (size == d->iconSize)
        return;
    d->iconSize = size;
    d->doDelayedItemsLayout();
    emit iconSizeChanged(size);
}